

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int prof_gdump_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                  size_t newlen)

{
  return 2;
}

Assistant:

static int
prof_gdump_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	bool oldval;

	if (!config_prof) {
		return ENOENT;
	}

	if (newp != NULL) {
		if (!opt_prof) {
			ret = ENOENT;
			goto label_return;
		}
		if (newlen != sizeof(bool)) {
			ret = EINVAL;
			goto label_return;
		}
		oldval = prof_gdump_set(tsd_tsdn(tsd), *(bool *)newp);
	} else {
		oldval = opt_prof ? prof_gdump_get(tsd_tsdn(tsd)) : false;
	}
	READ(oldval, bool);

	ret = 0;
label_return:
	return ret;
}